

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

enable_if_t<std::is_base_of<interface_type,_CustOtherImpl>::value,_interface_reference> __thiscall
poly::
vector<custom::CustInterface,_std::allocator<custom::CustInterface>,_custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>_>
::emplace_back<custom::CustOtherImpl>
          (vector<custom::CustInterface,_std::allocator<custom::CustInterface>,_custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>_>
           *this)

{
  CustInterface *pCVar1;
  elem_ptr_pointer pvVar2;
  ulong uVar3;
  long v_2;
  elem_ptr_pointer pvVar4;
  long v;
  elem_ptr_pointer pvVar5;
  long v_1;
  elem_ptr_pointer pvVar6;
  long lVar7;
  
  pvVar2 = this->_free_elem;
  pvVar4 = (elem_ptr_pointer)this->_begin_storage;
  if ((pvVar2 != pvVar4) && (uVar3 = this->_align_max, 7 < uVar3)) {
    pvVar5 = pvVar4;
    if (pvVar2 != (elem_ptr_pointer)
                  (this->super_allocator_base<std::allocator<unsigned_char>_>)._storage) {
      pvVar5 = (elem_ptr_pointer)((long)pvVar2[-1].ptr.first + pvVar2[-1].sf.first);
    }
    if ((void_pointer)((long)pvVar5 + (uVar3 - ((long)pvVar5 + (uVar3 - 1)) % uVar3) + 7) <=
        (this->super_allocator_base<std::allocator<unsigned_char>_>)._end_storage) {
      if ((pvVar2 == pvVar4) || (uVar3 = this->_align_max, uVar3 < 8)) {
LAB_001d208a:
        __assert_fail("can_construct_new_elem(s, a)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fecjanky[P]poly_vector/include/poly/vector.h"
                      ,0x5a9,
                      "void poly::vector<custom::CustInterface, std::allocator<custom::CustInterface>, custom::CustomCloningPolicyT<custom::CustInterface>>::push_back_new_elem(type_tag<T>, Args &&...) [IF = custom::CustInterface, Allocator = std::allocator<custom::CustInterface>, CloningPolicy = custom::CustomCloningPolicyT<custom::CustInterface>, T = custom::CustOtherImpl, Args = <>]"
                     );
      }
      pvVar5 = (elem_ptr_pointer)
               (this->super_allocator_base<std::allocator<unsigned_char>_>)._storage;
      pvVar6 = pvVar4;
      if (pvVar2 != pvVar5) {
        pvVar6 = (elem_ptr_pointer)((long)pvVar2[-1].ptr.first + pvVar2[-1].sf.first);
      }
      if ((this->super_allocator_base<std::allocator<unsigned_char>_>)._end_storage <
          (void_pointer)((long)pvVar6 + (uVar3 - ((long)pvVar6 + (uVar3 - 1)) % uVar3) + 7))
      goto LAB_001d208a;
      if (pvVar2 != pvVar5) {
        pvVar4 = (elem_ptr_pointer)((long)pvVar2[-1].ptr.first + pvVar2[-1].sf.first);
      }
      lVar7 = (uVar3 - 1) - ((uVar3 - 1) + (long)pvVar4) % uVar3;
      pCVar1 = (CustInterface *)((long)pvVar4 + lVar7);
      *(undefined ***)((long)pvVar4 + lVar7) = &PTR_accept_002bfac0;
      pvVar2 = this->_free_elem;
      (pvVar2->ptr).first = pCVar1;
      (pvVar2->ptr).second = pCVar1;
      (pvVar2->sf).first = 8;
      (pvVar2->sf).second = 8;
      this->_free_elem = pvVar2 + 1;
      goto LAB_001d1fe2;
    }
  }
  push_back_new_elem_w_storage_increase<custom::CustOtherImpl>(this);
LAB_001d1fe2:
  return this->_free_elem[-1].ptr.second;
}

Assistant:

inline auto vector<IF, Allocator, CloningPolicy>::emplace_back(Args&&... args)
    -> std::enable_if_t<std::is_base_of<interface_type, T>::value, interface_reference>
{
    constexpr auto s = sizeof(T);
    constexpr auto a = alignof(T);
    if (!can_construct_new_elem(s, a)) {
        push_back_new_elem_w_storage_increase(type_tag<T> {}, std::forward<Args>(args)...);
    } else {
        push_back_new_elem(type_tag<T> {}, std::forward<Args>(args)...);
    }
    return back();
}